

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckColor(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var2;
  TidyAllocator *pTVar3;
  uint uVar4;
  Bool BVar5;
  tmbstr ptVar6;
  ctmbstr ptVar7;
  ctmbstr newName;
  tmbstr s;
  tmbstr cp;
  tmbstr given;
  Bool valid;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  given._4_4_ = no;
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else {
    cp = attval->value;
    if ((*cp != '#') && (given._4_4_ = IsValidColorCode(cp), given._4_4_ != no)) {
      p_Var2 = doc->allocator->vtbl->alloc;
      pTVar3 = doc->allocator;
      uVar4 = prvTidytmbstrlen(cp);
      ptVar6 = (tmbstr)(*p_Var2)(pTVar3,(long)uVar4 + 2);
      *ptVar6 = '#';
      s = ptVar6;
      do {
        s = s + 1;
        cVar1 = *cp;
        *s = cVar1;
        cp = cp + 1;
      } while (cVar1 != '\0');
      prvTidyReportAttrError(doc,node,attval,0x22a);
      (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
      attval->value = ptVar6;
      cp = ptVar6;
    }
    if ((given._4_4_ == no) && (*cp == '#')) {
      given._4_4_ = IsValidColorCode(cp + 1);
    }
    if (((given._4_4_ != no) && (*cp == '#')) && ((int)(doc->config).value[0x48].v != 0)) {
      BVar5 = prvTidyIsHTML5Mode(doc);
      ptVar7 = GetColorName(cp,BVar5);
      if (ptVar7 != (ctmbstr)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
        cp = prvTidytmbstrdup(doc->allocator,ptVar7);
        attval->value = cp;
      }
    }
    if (given._4_4_ == no) {
      BVar5 = prvTidyIsHTML5Mode(doc);
      ptVar7 = GetColorCode(cp,BVar5);
      given._4_4_ = (Bool)(ptVar7 != (ctmbstr)0x0);
    }
    if ((given._4_4_ == no) || (*cp != '#')) {
      if (given._4_4_ != no) {
        ptVar6 = prvTidytmbstrtolower(attval->value);
        attval->value = ptVar6;
      }
    }
    else {
      ptVar6 = prvTidytmbstrtoupper(attval->value);
      attval->value = ptVar6;
    }
    if (given._4_4_ == no) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
    }
  }
  return;
}

Assistant:

void CheckColor( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Bool valid = no;
    tmbstr given;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    given = attval->value;

    /* 727851 - add hash to hash-less color values */
    if (given[0] != '#' && (valid = IsValidColorCode(given)))
    {
        tmbstr cp, s;

        cp = s = (tmbstr) TidyDocAlloc(doc, 2 + TY_(tmbstrlen)(given));
        *cp++ = '#';
        while ('\0' != (*cp++ = *given++))
            continue;

        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE_REPLACED);

        TidyDocFree(doc, attval->value);
        given = attval->value = s;
    }

    if (!valid && given[0] == '#')
        valid = IsValidColorCode(given + 1);

    if (valid && given[0] == '#' && cfgBool(doc, TidyReplaceColor))
    {
        ctmbstr newName = GetColorName(given, TY_(IsHTML5Mode)(doc));

        if (newName)
        {
            TidyDocFree(doc, attval->value);
            given = attval->value = TY_(tmbstrdup)(doc->allocator, newName);
        }
    }

    /* if it is not a valid color code, it is a color name */
    if (!valid)
        valid = GetColorCode(given, TY_(IsHTML5Mode)(doc)) != NULL;

    if (valid && given[0] == '#')
        attval->value = TY_(tmbstrtoupper)(attval->value);
    else if (valid)
        attval->value = TY_(tmbstrtolower)(attval->value);

    if (!valid)
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}